

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O0

Gia_Man_t * Gia_ManFalseRebuild(Gia_Man_t *p,Vec_Wec_t *vHooks,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *vHook;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int local_3c;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fVeryVerbose_local;
  int fVerbose_local;
  Vec_Wec_t *vHooks_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart((iVar1 << 2) / 3);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  Gia_ManHashAlloc(p_00);
  local_3c = 1;
  while( true ) {
    bVar6 = false;
    if (local_3c < p->nObjs) {
      _Counter = Gia_ManObj(p,local_3c);
      bVar6 = _Counter != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(_Counter);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(_Counter);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(_Counter);
        if (iVar1 != 0) {
          iVar1 = Gia_ObjFanin0Copy(_Counter);
          uVar2 = Gia_ManAppendCo(p_00,iVar1);
          _Counter->Value = uVar2;
        }
      }
      else {
        uVar2 = Gia_ManAppendCi(p_00);
        _Counter->Value = uVar2;
      }
    }
    else {
      iVar1 = Vec_WecLevelSize(vHooks,local_3c);
      if (iVar1 < 1) {
        iVar1 = Gia_ObjFanin0Copy(_Counter);
        iLit1 = Gia_ObjFanin1Copy(_Counter);
        uVar2 = Gia_ManHashAnd(p_00,iVar1,iLit1);
        _Counter->Value = uVar2;
      }
      else {
        if (fVeryVerbose != 0) {
          printf("Path %d : ");
        }
        vHook = Vec_WecEntry(vHooks,local_3c);
        Gia_ManFalseRebuildOne(p_00,p,vHook,fVerbose,fVeryVerbose);
      }
    }
    local_3c = local_3c + 1;
  }
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManFalseRebuild( Gia_Man_t * p, Vec_Wec_t * vHooks, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    pNew = Gia_ManStart( 4 * Gia_ManObjNum(p) / 3 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Vec_WecLevelSize(vHooks, i) > 0 )
            {
                if ( fVeryVerbose )
                    printf( "Path %d : ", Counter++ );
                Gia_ManFalseRebuildOne( pNew, p, Vec_WecEntry(vHooks, i), fVerbose, fVeryVerbose );
            }
            else
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}